

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  char cVar5;
  bool bVar6;
  uint32_t uVar7;
  ExecutionModel EVar8;
  SPIREntryPoint *pSVar9;
  size_type sVar10;
  undefined8 *puVar11;
  CompilerError *this_00;
  long *plVar12;
  SPIRType *pSVar13;
  ulong uVar14;
  runtime_error *this_01;
  ulong *puVar15;
  size_type *psVar16;
  uint32_t uVar17;
  char *pcVar18;
  byte bVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  char (*in_R8) [4];
  BuiltIn builtin;
  string loc_qual;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar23;
  char cVar24;
  BuiltIn builtin_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  SPIRType *local_58;
  string local_50;
  
  pSVar9 = Compiler::get_entry_point((Compiler *)this);
  local_58 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id
                       );
  builtin_00 = BuiltInMax;
  bVar6 = Compiler::is_member_builtin
                    ((Compiler *)this,type,index,(BuiltIn *)&stack0xffffffffffffff3c);
  uVar23 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffff38);
  bVar6 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationResourceIndexPrimary);
  if (bVar6) {
    uVar7 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationResourceIndexPrimary);
    local_c0._M_dataplus._M_p._0_4_ = uVar7;
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)" [[id(",(char (*) [7])&local_c0,
               (uint *)0x2bd856,(char (*) [2])in_R8);
    local_c0._M_dataplus._M_p._0_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,index,
                    SPIRVCrossDecorationInterfaceOrigID);
    sVar10 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                     (key_type *)&local_c0);
    if (sVar10 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_a0 = __return_storage_ptr__;
  if ((pSVar9->model == ExecutionModelVertex) && (type->storage == StorageClassInput)) {
    if ((char)((uint)uVar23 >> 0x18) != '\0') {
      if (((0x2b < (ulong)builtin_00) || ((0xc0000000060U >> ((ulong)builtin_00 & 0x3f) & 1) == 0))
         && (1 < builtin_00 - BuiltInBaseVertex)) {
        if (builtin_00 != BuiltInDrawIndex) goto switchD_0022928c_caseD_2;
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"DrawIndex is not supported in MSL.");
        goto LAB_0022a63e;
      }
      if ((this->msl_options).vertex_for_tessellation == true) goto switchD_0022928c_caseD_2;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
      uVar14 = CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length) +
               local_98._M_string_length;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar21 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < uVar14) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar21 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < uVar14) goto LAB_0022914e;
        puVar11 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
      }
      else {
LAB_0022914e:
        puVar11 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      puVar15 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_c0.field_2._M_allocated_capacity = *puVar15;
        local_c0.field_2._8_8_ = puVar11[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *puVar15;
        local_c0._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_c0._M_string_length = puVar11[1];
      *puVar11 = puVar15;
      puVar11[1] = 0;
      *(undefined1 *)puVar15 = 0;
      plVar12 = (long *)::std::__cxx11::string::append((char *)&local_c0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar16 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar16) {
        lVar2 = plVar12[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar12;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
      }
      __return_storage_ptr__->_M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      goto LAB_0022960d;
    }
    uVar7 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
    if (uVar7 == 0xffffffff) goto LAB_002291fe;
    paVar20 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar20;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[attribute(","");
    __return_storage_ptr__ = local_a0;
    cVar24 = '\x01';
    if (9 < uVar7) {
      uVar17 = uVar7;
      cVar5 = '\x04';
      do {
        cVar24 = cVar5;
        if (uVar17 < 100) {
          cVar24 = cVar24 + -2;
          goto LAB_00229644;
        }
        if (uVar17 < 1000) {
          cVar24 = cVar24 + -1;
          goto LAB_00229644;
        }
        if (uVar17 < 10000) goto LAB_00229644;
        bVar6 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        cVar5 = cVar24 + '\x04';
      } while (bVar6);
      cVar24 = cVar24 + '\x01';
    }
LAB_00229644:
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct((ulong)&local_78,cVar24);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar7);
    uVar14 = CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length) +
             local_98._M_string_length;
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar20) {
      uVar21 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < uVar14) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        uVar21 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < uVar14) goto LAB_002296a9;
      puVar11 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
    }
    else {
LAB_002296a9:
      puVar11 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    puVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_c0.field_2._M_allocated_capacity = *puVar15;
      local_c0.field_2._8_8_ = puVar11[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *puVar15;
      local_c0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_c0._M_string_length = puVar11[1];
    *puVar11 = puVar15;
    puVar11[1] = 0;
    *(undefined1 *)puVar15 = 0;
    plVar12 = (long *)::std::__cxx11::string::append((char *)&local_c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar16 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar16) {
      lVar2 = plVar12[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar12;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
    }
    __return_storage_ptr__->_M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    _Var22._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
      _Var22._M_p = local_98._M_dataplus._M_p;
    }
    goto LAB_00229788;
  }
LAB_002291fe:
  EVar8 = Compiler::get_execution_model((Compiler *)this);
  bVar19 = 1;
  if ((EVar8 != ExecutionModelMeshEXT) &&
     (EVar8 = Compiler::get_execution_model((Compiler *)this),
     EVar8 != ExecutionModelTessellationEvaluation)) {
    if (pSVar9->model == ExecutionModelVertex) {
      bVar19 = (this->msl_options).vertex_for_tessellation ^ 1;
    }
    else {
      bVar19 = 0;
    }
  }
  if (type->storage != StorageClassOutput) {
    EVar8 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar8 == ExecutionModelMeshEXT & bVar19) != 0) goto LAB_00229260;
LAB_00229363:
    if (((pSVar9->model == ExecutionModelVertex) &&
        ((this->msl_options).vertex_for_tessellation == true)) &&
       (type->storage == StorageClassOutput)) {
LAB_00229860:
      if ((char)((uint)uVar23 >> 0x18) != '\0') {
        get_or_allocate_builtin_output_member_location
                  (this,builtin_00,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
switchD_0022928c_caseD_2:
      psVar4 = local_a0;
      (local_a0->_M_dataplus)._M_p = (pointer)&local_a0->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
      return psVar4;
    }
    EVar8 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar8 == ExecutionModelTessellationControl) && (type->storage == StorageClassInput)) {
      cVar24 = (char)((uint)uVar23 >> 0x18);
      if (cVar24 != '\0') {
        if ((int)builtin_00 < 0x24) {
          if (1 < builtin_00 - BuiltInPrimitiveId) {
            if (builtin_00 == BuiltInPatchVertices) goto switchD_0022928c_caseD_2;
            goto LAB_0022979f;
          }
          if ((this->msl_options).multi_patch_workgroup == true) goto switchD_0022928c_caseD_2;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
          __return_storage_ptr__ = local_a0;
          builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
          ::std::operator+(&local_98,&local_78,&local_50);
          puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_c0.field_2._M_allocated_capacity = *puVar15;
            local_c0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar15;
            local_c0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_c0._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          pcVar18 = " ";
          if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            pcVar18 = "";
          }
          ::std::operator+(__return_storage_ptr__,&local_c0,pcVar18);
        }
        else {
          if ((builtin_00 != BuiltInSubgroupSize) &&
             (builtin_00 != BuiltInSubgroupLocalInvocationId)) goto LAB_0022979f;
          if ((this->msl_options).emulate_subgroups == true) goto switchD_0022928c_caseD_2;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
          __return_storage_ptr__ = local_a0;
          builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
          ::std::operator+(&local_98,&local_78,&local_50);
          puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_c0.field_2._M_allocated_capacity = *puVar15;
            local_c0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar15;
            local_c0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_c0._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          pcVar18 = " ";
          if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            pcVar18 = "";
          }
          ::std::operator+(__return_storage_ptr__,&local_c0,pcVar18);
        }
        goto LAB_00229b41;
      }
LAB_0022979f:
      if ((this->msl_options).multi_patch_workgroup == true) goto switchD_0022928c_caseD_2;
      if (cVar24 == '\0') {
        local_50._M_dataplus._M_p._0_4_ =
             get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
      else {
        in_R8 = (char (*) [4])0x0;
        local_50._M_dataplus._M_p._0_4_ =
             get_or_allocate_builtin_input_member_location
                       (this,builtin_00,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
      if ((uint32_t)local_50._M_dataplus._M_p != 0xffffffff) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[attribute(","");
        convert_to_string<unsigned_int,_0>(&local_78,(uint *)&local_50);
        __return_storage_ptr__ = local_a0;
        ::std::operator+(&local_c0,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&local_c0,")]]");
        goto LAB_0022960d;
      }
    }
    EVar8 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar8 == ExecutionModelTessellationControl) && (type->storage == StorageClassOutput))
    goto LAB_00229860;
    EVar8 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar8 == ExecutionModelTessellationEvaluation) && (type->storage == StorageClassInput)) {
      if ((char)((uint)uVar23 >> 0x18) == '\0') {
LAB_0022993f:
        if (((this->msl_options).raw_buffer_tese_input == true) ||
           (pSVar13 = Compiler::get_type((Compiler *)this,
                                         (TypeID)(type->member_types).
                                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                                 .ptr[index].id),
           pSVar13->basetype == ControlPointArray)) goto switchD_0022928c_caseD_2;
        if ((char)((uint)uVar23 >> 0x18) == '\0') {
          local_50._M_dataplus._M_p._0_4_ =
               get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
        }
        else {
          in_R8 = (char (*) [4])0x0;
          local_50._M_dataplus._M_p._0_4_ =
               get_or_allocate_builtin_input_member_location
                         (this,builtin_00,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
        }
        if ((uint32_t)local_50._M_dataplus._M_p == 0xffffffff) goto LAB_00229e9f;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[attribute(","");
        convert_to_string<unsigned_int,_0>(&local_78,(uint *)&local_50);
        __return_storage_ptr__ = local_a0;
        ::std::operator+(&local_c0,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&local_c0,")]]");
      }
      else {
        if (builtin_00 != BuiltInPrimitiveId) {
          if (builtin_00 == BuiltInPatchVertices) goto switchD_0022928c_caseD_2;
          if (builtin_00 != BuiltInTessCoord) goto LAB_0022993f;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
        builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
        __return_storage_ptr__ = local_a0;
        ::std::operator+(&local_c0,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&local_c0,"]]");
      }
    }
    else {
LAB_00229e9f:
      if ((pSVar9->model == ExecutionModelFragment) && (type->storage == StorageClassInput)) {
        paVar20 = &local_c0.field_2;
        local_c0._M_string_length = 0;
        local_c0.field_2._M_allocated_capacity =
             local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_c0._M_dataplus._M_p = (pointer)paVar20;
        if ((char)((uint)uVar23 >> 0x18) == '\0') {
          member_location_attribute_qualifier_abi_cxx11_(&local_98,this,type,index);
LAB_00229f64:
          ::std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
LAB_00229f88:
          if ((builtin_00 == BuiltInBaryCoordKHR) &&
             (bVar6 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationNoPerspective), bVar6)) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_01,"NoPerspective decorations are not supported for BaryCoord inputs.");
            goto LAB_0022a670;
          }
          if ((7 < local_58->basetype - SByte) &&
             (((byte)((uint)uVar23 >> 0x18) & builtin_00 == BuiltInFragCoord) == 0)) {
            bVar6 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               DecorationFlat);
            if (bVar6) {
              if (local_c0._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&local_c0);
              }
            }
            else {
              bVar6 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationCentroid);
              if (bVar6) {
                if (local_c0._M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)&local_c0);
                }
                if ((builtin_00 & ~BuiltInPointSize) == BuiltInBaryCoordKHR) {
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ::std::runtime_error::runtime_error
                            (this_01,"Centroid interpolation not supported for barycentrics in MSL."
                            );
LAB_0022a670:
                  *(undefined ***)this_01 = &PTR__runtime_error_0035fca8;
                  __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationNoPerspective);
              }
              else {
                bVar6 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                   DecorationSample);
                if (bVar6) {
                  if (local_c0._M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)&local_c0);
                  }
                  if ((builtin_00 & ~BuiltInPointSize) == BuiltInBaryCoordKHR) {
                    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (this_01,"Sample interpolation not supported for barycentrics in MSL."
                              );
                    goto LAB_0022a670;
                  }
                  Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationNoPerspective);
                }
                else {
                  bVar6 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationNoPerspective);
                  if (bVar6 || builtin_00 == BuiltInBaryCoordNoPerspKHR) {
                    if (local_c0._M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)&local_c0);
                    }
                  }
                  else {
                    if (builtin_00 != BuiltInBaryCoordKHR) goto LAB_0022a1c4;
                    if (local_c0._M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)&local_c0);
                    }
                  }
                }
              }
            }
            ::std::__cxx11::string::append((char *)&local_c0);
          }
LAB_0022a1c4:
          if (local_c0._M_string_length == 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar20) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            goto LAB_0022a227;
          }
          ::std::operator+(&local_98," [[",&local_c0);
          __return_storage_ptr__ = local_a0;
          ::std::operator+(local_a0,&local_98,"]]");
          _Var22._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
            _Var22._M_p = local_c0._M_dataplus._M_p;
          }
        }
        else {
          if (BuiltInSampleMask < builtin_00) {
LAB_00229f48:
            if ((builtin_00 - BuiltInBaryCoordKHR < 2) ||
               (((builtin_00 == BuiltInViewIndex && ((this->msl_options).multiview == true)) &&
                ((this->msl_options).multiview_layered_rendering == true)))) {
LAB_00229f57:
              builtin_qualifier_abi_cxx11_(&local_98,this,builtin_00);
              goto LAB_00229f64;
            }
            goto LAB_00229f88;
          }
          if ((0x178200U >> (builtin_00 & BuiltInGlobalSize) & 1) != 0) goto LAB_00229f57;
          if (builtin_00 == BuiltInClipDistance) {
            uVar7 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               DecorationIndex);
            __return_storage_ptr__ = local_a0;
            local_98._M_dataplus._M_p._0_4_ = uVar7;
            join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                      (local_a0,(spirv_cross *)" [[user(clip",(char (*) [13])&local_98,(uint *)")]]"
                       ,in_R8);
            _Var22._M_p = local_c0._M_dataplus._M_p;
          }
          else {
            if (builtin_00 != BuiltInCullDistance) goto LAB_00229f48;
            uVar7 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               DecorationIndex);
            __return_storage_ptr__ = local_a0;
            local_98._M_dataplus._M_p._0_4_ = uVar7;
            join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                      (local_a0,(spirv_cross *)" [[user(cull",(char (*) [13])&local_98,(uint *)")]]"
                       ,in_R8);
            _Var22._M_p = local_c0._M_dataplus._M_p;
          }
        }
LAB_00229788:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var22._M_p == paVar20) {
          return __return_storage_ptr__;
        }
        goto LAB_00229b83;
      }
LAB_0022a227:
      __return_storage_ptr__ = local_a0;
      bVar19 = (byte)((uint)uVar23 >> 0x18);
      if (type->storage == StorageClassOutput && pSVar9->model == ExecutionModelFragment) {
        if (bVar19 == 0) {
          uVar7 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
          local_c0._M_dataplus._M_p._0_4_ = uVar7;
          if (uVar7 != 0xffffffff) {
            if (((this->msl_options).enable_frag_output_mask >> (uVar7 & 0x1f) & 1) == 0) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"")
              ;
              return __return_storage_ptr__;
            }
            if ((uVar7 != 0xffffffff) &&
               (bVar6 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                   DecorationIndex), bVar6)) {
              local_98._M_dataplus._M_p._0_4_ =
                   Compiler::get_member_decoration
                             ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                              DecorationIndex);
              join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
                        (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&local_c0,
                         (uint *)"), index(",(char (*) [10])&local_98,(uint *)")]]",
                         (char (*) [4])CONCAT44(builtin_00,uVar23));
              return __return_storage_ptr__;
            }
          }
          if ((uint32_t)local_c0._M_dataplus._M_p != -1) {
            join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                      (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&local_c0,
                       (uint *)")]]",in_R8);
            return __return_storage_ptr__;
          }
          bVar6 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationIndex);
          if (bVar6) {
            local_98._M_dataplus._M_p._0_4_ =
                 Compiler::get_member_decoration
                           ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationIndex);
            join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                      (__return_storage_ptr__,(spirv_cross *)" [[index(",(char (*) [10])&local_98,
                       (uint *)")]]",in_R8);
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          return __return_storage_ptr__;
        }
        if (builtin_00 != BuiltInSampleMask) {
          if (builtin_00 != BuiltInFragDepth) {
            if ((builtin_00 != BuiltInFragStencilRefEXT) ||
               ((this->msl_options).enable_frag_stencil_ref_builtin == false))
            goto switchD_0022928c_caseD_2;
            if ((this->msl_options).msl_version < 0x4e84) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,"Stencil export only supported in MSL 2.1 and up.");
LAB_0022a63e:
              __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
            builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
            ::std::operator+(&local_c0,&local_98,&local_78);
            ::std::operator+(__return_storage_ptr__,&local_c0,"]]");
            goto LAB_0022960d;
          }
          if ((this->msl_options).enable_frag_depth_builtin == false) goto switchD_0022928c_caseD_2;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
        builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
        ::std::operator+(&local_c0,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&local_c0,"]]");
      }
      else {
        if ((((bVar19 & (type->storage == StorageClassInput &&
                        pSVar9->model == ExecutionModelGLCompute)) != 1) ||
            (uVar14 = (ulong)builtin_00, 0x29 < uVar14)) ||
           (((0x3d000000UL >> (uVar14 & 0x3f) & 1) == 0 &&
            (((0x35000000000U >> (uVar14 & 0x3f) & 1) == 0 ||
             ((this->msl_options).emulate_subgroups != false)))))) goto switchD_0022928c_caseD_2;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
        builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
        ::std::operator+(&local_c0,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&local_c0,"]]");
      }
    }
LAB_0022960d:
    paVar20 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    _Var22._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
      _Var22._M_p = local_98._M_dataplus._M_p;
    }
    goto LAB_00229b7e;
  }
  if (bVar19 == 0) goto LAB_00229363;
LAB_00229260:
  __return_storage_ptr__ = local_a0;
  if ((char)((uint)uVar23 >> 0x18) == '\0') {
    member_location_attribute_qualifier_abi_cxx11_(&local_c0,this,type,index);
    __return_storage_ptr__ = local_a0;
    if (local_c0._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      goto LAB_00229363;
    }
    join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
              (local_a0,(spirv_cross *)" [[",(char (*) [4])&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d3f0a,
               (char (*) [3])in_R8);
    pbVar3 = &local_c0;
LAB_0022933e:
    _Var22._M_p = (pointer)(&(pbVar3->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var22._M_p == &pbVar3->field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00229b83;
  }
  switch(builtin_00) {
  case BuiltInPosition:
  case BuiltInPrimitiveId:
  case BuiltInLayer:
    break;
  case BuiltInPointSize:
    bVar6 = (this->msl_options).enable_point_size_builtin;
    if (bVar6 == true) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
      ::std::operator+(&local_c0,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&local_c0,"]]");
    }
    else {
      (local_a0->_M_dataplus)._M_p = (pointer)&local_a0->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
    }
    if (bVar6 == false) {
      return __return_storage_ptr__;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pbVar3 = &local_98;
    goto LAB_0022933e;
  case 2:
  case BuiltInVertexId:
  case BuiltInInstanceId:
  case BuiltInInvocationId:
    goto switchD_0022928c_caseD_2;
  case BuiltInClipDistance:
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex
                      );
    if (bVar6) {
      local_c0._M_dataplus._M_p._0_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex)
      ;
      pcVar18 = " [[user(clip";
LAB_00229c1b:
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)pcVar18,(char (*) [13])&local_c0,
                 (uint *)")]]",in_R8);
      return __return_storage_ptr__;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
    builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
    ::std::operator+(&local_98,&local_78,&local_50);
    puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    puVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_c0.field_2._M_allocated_capacity = *puVar15;
      local_c0.field_2._8_8_ = puVar11[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *puVar15;
      local_c0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_c0._M_string_length = puVar11[1];
    *puVar11 = puVar15;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    pcVar18 = " ";
    if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pcVar18 = "";
    }
    ::std::operator+(__return_storage_ptr__,&local_c0,pcVar18);
    goto LAB_00229b41;
  case BuiltInCullDistance:
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex
                      );
    if (bVar6) {
      local_c0._M_dataplus._M_p._0_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex)
      ;
      pcVar18 = " [[user(cull";
      goto LAB_00229c1b;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
    builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
    ::std::operator+(&local_98,&local_78,&local_50);
    puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    puVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_c0.field_2._M_allocated_capacity = *puVar15;
      local_c0.field_2._8_8_ = puVar11[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *puVar15;
      local_c0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_c0._M_string_length = puVar11[1];
    *puVar11 = puVar15;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    pcVar18 = " ";
    if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pcVar18 = "";
    }
    ::std::operator+(__return_storage_ptr__,&local_c0,pcVar18);
    goto LAB_00229b41;
  case BuiltInViewportIndex:
    if ((this->msl_options).msl_version < 20000) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"ViewportIndex requires Metal 2.0.");
      goto LAB_0022a63e;
    }
    break;
  default:
    if ((builtin_00 != BuiltInPrimitiveShadingRateKHR) && (builtin_00 != BuiltInCullPrimitiveEXT))
    goto switchD_0022928c_caseD_2;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
  builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
  uVar14 = local_50._M_string_length +
           CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    uVar21 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < uVar14) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      uVar21 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < uVar14) goto LAB_00229a1e;
    puVar11 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&local_50,0,(char *)0x0,(ulong)local_78._M_dataplus._M_p);
  }
  else {
LAB_00229a1e:
    puVar11 = (undefined8 *)
              ::std::__cxx11::string::_M_append
                        ((char *)&local_78,
                         CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                  (uint32_t)local_50._M_dataplus._M_p));
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  puVar15 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_98.field_2._M_allocated_capacity = *puVar15;
    local_98.field_2._8_8_ = puVar11[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *puVar15;
    local_98._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_98._M_string_length = puVar11[1];
  *puVar11 = puVar15;
  puVar11[1] = 0;
  *(undefined1 *)puVar15 = 0;
  puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  puVar15 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_c0.field_2._M_allocated_capacity = *puVar15;
    local_c0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *puVar15;
    local_c0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_c0._M_string_length = puVar11[1];
  *puVar11 = puVar15;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  plVar12 = (long *)::std::__cxx11::string::append((char *)&local_c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar16 = (size_type *)(plVar12 + 2);
  if ((size_type *)*plVar12 == psVar16) {
    lVar2 = plVar12[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar12;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
  }
  __return_storage_ptr__->_M_string_length = plVar12[1];
  *plVar12 = (long)psVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
LAB_00229b41:
  paVar20 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  _Var22._M_p = local_78._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p));
    _Var22._M_p = local_78._M_dataplus._M_p;
  }
LAB_00229b7e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var22._M_p != paVar20) {
LAB_00229b83:
    operator_delete(_Var22._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	bool use_semantic_stage_output = is_mesh_shader() || is_tese_shader() ||
	                                 (execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation);

	// Vertex, mesh and tessellation evaluation function outputs
	if ((type.storage == StorageClassOutput || is_mesh_shader()) && use_semantic_stage_output)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
			case BuiltInCullPrimitiveEXT:
			case BuiltInPrimitiveShadingRateKHR:
			case BuiltInPrimitiveId:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR && has_member_decoration(type.self, index, DecorationNoPerspective))
		{
			// NoPerspective is baked into the builtin type.
			SPIRV_CROSS_THROW("NoPerspective decorations are not supported for BaryCoord inputs.");
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";

				if (builtin == BuiltInBaryCoordNoPerspKHR || builtin == BuiltInBaryCoordKHR)
					SPIRV_CROSS_THROW("Centroid interpolation not supported for barycentrics in MSL.");

				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";

				if (builtin == BuiltInBaryCoordNoPerspKHR || builtin == BuiltInBaryCoordKHR)
					SPIRV_CROSS_THROW("Sample interpolation not supported for barycentrics in MSL.");

				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective) || builtin == BuiltInBaryCoordNoPerspKHR)
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
			else if (builtin == BuiltInBaryCoordKHR)
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}